

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullComputer.cpp
# Opt level: O2

cbtVector3 __thiscall cbtConvexHullInternal::getBtNormal(cbtConvexHullInternal *this,Face *face)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar8;
  cbtVector3 local_48;
  cbtVector3 local_38;
  cbtVector3 local_28;
  
  auVar7 = in_ZMM0._8_56_;
  cVar8 = toBtVector(this,&face->dir0);
  auVar4._0_8_ = cVar8.m_floats._0_8_;
  auVar4._8_56_ = auVar7;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = cVar8.m_floats._8_8_;
  local_38.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar4._0_16_,auVar1);
  auVar7 = ZEXT856(local_38.m_floats._8_8_);
  cVar8 = toBtVector(this,&face->dir1);
  auVar5._0_8_ = cVar8.m_floats._0_8_;
  auVar5._8_56_ = auVar7;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = cVar8.m_floats._8_8_;
  local_48.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar2);
  auVar7 = ZEXT856(local_48.m_floats._8_8_);
  cVar8 = cbtVector3::cross(&local_38,&local_48);
  auVar6._0_8_ = cVar8.m_floats._0_8_;
  auVar6._8_56_ = auVar7;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = cVar8.m_floats._8_8_;
  local_28.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar6._0_16_,auVar3);
  cVar8 = cbtVector3::normalized(&local_28);
  return (cbtVector3)cVar8.m_floats;
}

Assistant:

cbtVector3 cbtConvexHullInternal::getBtNormal(Face* face)
{
	return toBtVector(face->dir0).cross(toBtVector(face->dir1)).normalized();
}